

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O3

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::_M_initialize_buckets
          (hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
           *this,size_type __n)

{
  undefined1 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  value_type local_28;
  
  uVar2 = 0x1f;
  puVar1 = get_stl_prime_list()::_stl_prime_list;
  do {
    uVar3 = uVar2 >> 1;
    uVar4 = ~uVar3 + uVar2;
    uVar2 = uVar3;
    if (*(ulong *)((long)puVar1 + uVar3 * 8) < __n) {
      puVar1 = (undefined1 *)((ulong *)((long)puVar1 + uVar3 * 8) + 1);
      uVar2 = uVar4;
    }
  } while (0 < (long)uVar2);
  if (puVar1 == "failed to write hello to ostr") {
    uVar2 = 0xfffffffb;
  }
  else {
    uVar2 = *(ulong *)puVar1;
  }
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
  reserve(&this->_M_buckets,uVar2);
  local_28 = (value_type)0x0;
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
  _M_fill_insert(&this->_M_buckets,
                 (iterator)
                 (this->_M_buckets).
                 super__Vector_base<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,uVar2,&local_28);
  this->_M_num_elements = 0;
  return;
}

Assistant:

void _M_initialize_buckets(size_type __n)
  {
    const size_type __n_buckets = _M_next_size(__n);
    _M_buckets.reserve(__n_buckets);
    _M_buckets.insert(_M_buckets.end(), __n_buckets, (_Node*) 0);
    _M_num_elements = 0;
  }